

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

int av1_set_active_map(AV1_COMP *cpi,uchar *new_map_16x16,int rows,int cols)

{
  int iVar1;
  int iVar2;
  uchar *puVar3;
  uchar uVar4;
  int local_64;
  int local_60;
  int y;
  int x;
  int col_max;
  int row_max;
  uint8_t val;
  int c;
  int r;
  int num_blocks_inactive;
  int num_samples;
  int mi_cols;
  int mi_rows;
  uchar *active_map_4x4;
  CommonModeInfoParams *mi_params;
  int cols_local;
  int rows_local;
  uchar *new_map_16x16_local;
  AV1_COMP *cpi_local;
  int local_4;
  
  if ((rows == (cpi->common).mi_params.mb_rows) && (cols == (cpi->common).mi_params.mb_cols)) {
    puVar3 = (cpi->active_map).map;
    iVar1 = (cpi->common).mi_params.mi_rows;
    iVar2 = (cpi->common).mi_params.mi_cols;
    (cpi->active_map).update = 0;
    (cpi->rc).percent_blocks_inactive = 0;
    if (new_map_16x16 != (uchar *)0x0) {
      num_samples = 0;
      num_blocks_inactive = 0;
      for (r = 0; r < iVar1; r = r + 4) {
        for (c = 0; c < iVar2; c = c + 4) {
          uVar4 = '\a';
          if (new_map_16x16[(r >> 2) * cols + (c >> 2)] != '\0') {
            uVar4 = '\0';
          }
          num_samples = num_samples + 1;
          if (uVar4 == '\a') {
            num_blocks_inactive = num_blocks_inactive + 1;
          }
          if (iVar1 - r < 5) {
            local_60 = iVar1 - r;
          }
          else {
            local_60 = 4;
          }
          if (iVar2 - c < 5) {
            local_64 = iVar2 - c;
          }
          else {
            local_64 = 4;
          }
          for (x = 0; x < local_60; x = x + 1) {
            for (y = 0; y < local_64; y = y + 1) {
              puVar3[(r + x) * iVar2 + c + y] = uVar4;
            }
          }
        }
      }
      (cpi->active_map).enabled = 1;
      (cpi->active_map).update = 1;
      (cpi->rc).percent_blocks_inactive = (num_blocks_inactive * 100) / num_samples;
    }
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int av1_set_active_map(AV1_COMP *cpi, unsigned char *new_map_16x16, int rows,
                       int cols) {
  const CommonModeInfoParams *const mi_params = &cpi->common.mi_params;
  if (rows == mi_params->mb_rows && cols == mi_params->mb_cols) {
    unsigned char *const active_map_4x4 = cpi->active_map.map;
    const int mi_rows = mi_params->mi_rows;
    const int mi_cols = mi_params->mi_cols;
    cpi->active_map.update = 0;
    cpi->rc.percent_blocks_inactive = 0;
    assert(mi_rows % 2 == 0 && mi_rows > 0);
    assert(mi_cols % 2 == 0 && mi_cols > 0);
    if (new_map_16x16) {
      int num_samples = 0;
      int num_blocks_inactive = 0;
      for (int r = 0; r < mi_rows; r += 4) {
        for (int c = 0; c < mi_cols; c += 4) {
          const uint8_t val = new_map_16x16[(r >> 2) * cols + (c >> 2)]
                                  ? AM_SEGMENT_ID_ACTIVE
                                  : AM_SEGMENT_ID_INACTIVE;
          num_samples++;
          if (val == AM_SEGMENT_ID_INACTIVE) num_blocks_inactive++;
          const int row_max = AOMMIN(4, mi_rows - r);
          const int col_max = AOMMIN(4, mi_cols - c);
          for (int x = 0; x < row_max; ++x) {
            for (int y = 0; y < col_max; ++y) {
              active_map_4x4[(r + x) * mi_cols + (c + y)] = val;
            }
          }
        }
      }
      cpi->active_map.enabled = 1;
      cpi->active_map.update = 1;
      assert(num_samples);
      cpi->rc.percent_blocks_inactive =
          (num_blocks_inactive * 100) / num_samples;
    }
    return 0;
  }

  return -1;
}